

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_string.c
# Opt level: O3

PVIPString * PVIP_string_new(void)

{
  PVIPString *pPVar1;
  char *pcVar2;
  PVIPString *extraout_RAX;
  undefined8 *__ptr;
  
  __ptr = (undefined8 *)0x1;
  pPVar1 = (PVIPString *)calloc(1,0x18);
  if (pPVar1 == (PVIPString *)0x0) {
    PVIP_string_new_cold_2();
  }
  else {
    pPVar1->buflen = 0x100;
    __ptr = (undefined8 *)0x100;
    pcVar2 = (char *)malloc(0x100);
    pPVar1->buf = pcVar2;
    if (pcVar2 != (char *)0x0) {
      return pPVar1;
    }
  }
  PVIP_string_new_cold_1();
  free((void *)*__ptr);
  free(__ptr);
  return extraout_RAX;
}

Assistant:

PVIPString *PVIP_string_new() {
    PVIPString *str = malloc(sizeof(PVIPString));
    if (!str) {
        fprintf(stderr, "[PVIP] Cannot allocate memory\n");
        abort();
    }
    memset(str, 0, sizeof(PVIPString));
    str->len    = 0;
    str->buflen = 256;
    str->buf    = malloc(str->buflen);
    if (!str->buf) {
        fprintf(stderr, "[PVIP] Cannot allocate memory\n");
        abort();
    }
    return str;
}